

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O1

void Bac_ObjSetName(Bac_Ntk_t *p,int i,int x)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  byte bVar5;
  
  if ((-1 < i) && (iVar1 = (p->vType).nSize, i < iVar1)) {
    pcVar3 = (p->vType).pArray;
    uVar4 = (ulong)(uint)i;
    bVar5 = pcVar3[uVar4] & 0xfc;
    if (bVar5 == 4) {
      if (i < (p->vFanin).nSize) {
        iVar2 = (p->vFanin).pArray[uVar4];
        uVar4 = (ulong)iVar2;
        if (((long)uVar4 < 0) || (iVar1 <= iVar2)) goto LAB_003b85b1;
        if ((pcVar3[uVar4] & 0xfcU) == 4) {
          __assert_fail("!Bac_ObjIsCo(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0x11f,"int Bac_ObjNameInt(Bac_Ntk_t *, int)");
        }
        if (iVar2 < (p->vName).nSize) goto LAB_003b8595;
      }
    }
    else if (i < (p->vName).nSize) {
LAB_003b8595:
      if ((bVar5 != 4) && ((p->vName).pArray[uVar4] == 0)) {
        Vec_IntSetEntry(&p->vName,i,x);
        return;
      }
      __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_003b85b1:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline void           Bac_ObjSetName( Bac_Ntk_t * p, int i, int x )   { assert(Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)); Vec_IntSetEntry( &p->vName, i, x );   }